

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

int av1_find_best_obmc_sub_pixel_tree_up
              (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,MV start_mv,
              FULLPEL_MV_STATS *start_mv_stats,MV *bestmv,int *distortion,uint *sse1,
              int_mv *last_mv_search_list)

{
  MV_COST_PARAMS *mv_cost_params;
  SUBPEL_SEARCH_VAR_PARAMS *var_params;
  SubpelMvLimits *mv_limits;
  byte bVar1;
  SUBPEL_SEARCH_TYPE SVar2;
  MV_COST_TYPE MVar3;
  ushort uVar4;
  int iVar5;
  buf_2d *pbVar6;
  MV *pMVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ushort uVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  uint uVar20;
  short sVar21;
  bool bVar22;
  uint local_a8;
  MV diag_mv;
  int dummy;
  MV right_mv;
  MV left_mv;
  MV top_mv;
  MV bottom_mv;
  int local_40;
  
  bVar1 = ms_params->forced_stop;
  iVar5 = ms_params->iters_per_step;
  iVar8 = 3 - (uint)bVar1;
  local_40 = 3 - (uint)(ms_params->allow_hp == 0);
  mv_cost_params = &ms_params->mv_cost_params;
  if (iVar8 < local_40) {
    local_40 = iVar8;
  }
  var_params = &ms_params->var_params;
  SVar2 = (ms_params->var_params).subpel_search_type;
  *bestmv = start_mv;
  if (SVar2 == '\0') {
    pbVar6 = (ms_params->var_params).ms_buffers.ref;
    local_a8 = (*((ms_params->var_params).vfp)->ovf)
                         (pbVar6->buf,pbVar6->stride,(ms_params->var_params).ms_buffers.wsrc,
                          (ms_params->var_params).ms_buffers.obmc_mask,sse1);
  }
  else {
    local_a8 = upsampled_obmc_pref_error(xd,cm,bestmv,var_params,sse1);
  }
  *distortion = local_a8;
  MVar3 = (ms_params->mv_cost_params).mv_cost_type;
  iVar8 = 0;
  if (MVar3 != '\x04') {
    sVar17 = mv_cost_params->ref_mv->row;
    sVar16 = mv_cost_params->ref_mv->col;
    sVar15 = bestmv->row - sVar17;
    sVar18 = bestmv->col - sVar16;
    sVar21 = -sVar15;
    if (0 < sVar15) {
      sVar21 = sVar15;
    }
    sVar19 = -sVar18;
    if (0 < sVar18) {
      sVar19 = sVar18;
    }
    if (MVar3 == '\x03') {
      iVar8 = (int)sVar19 + (int)sVar21 >> 3;
    }
    else if (MVar3 == '\x01') {
      iVar8 = (int)sVar19 + (int)sVar21 >> 2;
    }
    else {
      iVar8 = 0;
      if (MVar3 == '\0') {
        iVar8 = (int)(((long)(ms_params->mv_cost_params).mvcost[1][sVar18] +
                       (long)(ms_params->mv_cost_params).mvcost[0][sVar15] +
                      (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                    (ulong)((uint)(bestmv->col != sVar16) * 4 +
                                           (uint)(bestmv->row != sVar17) * 8))) *
                      (long)(ms_params->mv_cost_params).error_per_bit + 0x2000U >> 0xe);
      }
    }
  }
  local_a8 = iVar8 + local_a8;
  if (bVar1 < 3) {
    mv_limits = &ms_params->mv_limits;
    uVar20 = 4;
    do {
      uVar14 = bestmv->row;
      uVar4 = bestmv->col;
      dummy = 0;
      sVar17 = (short)uVar20;
      left_mv.col = uVar4 - sVar17;
      left_mv.row = uVar14;
      right_mv.col = uVar4 + sVar17;
      right_mv.row = uVar14;
      top_mv.col = uVar4;
      top_mv.row = uVar14 - sVar17;
      bottom_mv.col = uVar4;
      bottom_mv.row = uVar14 + sVar17;
      if ((ms_params->var_params).subpel_search_type == '\0') {
        iVar8 = mv_limits->col_min;
        uVar9 = 0x7fffffff;
        if (((left_mv.col < iVar8) || ((ms_params->mv_limits).col_max < (int)left_mv.col)) ||
           ((int)(short)uVar14 < (ms_params->mv_limits).row_min)) {
          uVar13 = 0x7fffffff;
        }
        else {
          uVar13 = 0x7fffffff;
          if ((int)(short)uVar14 <= (ms_params->mv_limits).row_max) {
            pbVar6 = (ms_params->var_params).ms_buffers.ref;
            iVar8 = pbVar6->stride;
            uVar10 = (*((ms_params->var_params).vfp)->osvf)
                               (pbVar6->buf +
                                (((int)left_mv.col >> 3) + (((int)left_mv << 0x10) >> 0x13) * iVar8)
                                ,iVar8,(ushort)left_mv.col & 7,uVar14 & 7,
                                (ms_params->var_params).ms_buffers.wsrc,
                                (ms_params->var_params).ms_buffers.obmc_mask,(uint *)&diag_mv);
            iVar8 = 0;
            if ((ms_params->mv_cost_params).mv_cost_type == '\0') {
              pMVar7 = (ms_params->mv_cost_params).ref_mv;
              sVar17 = (left_mv.col - pMVar7->col) * 8;
              sVar16 = (left_mv.row - pMVar7->row) * 8;
              iVar8 = ((ms_params->mv_cost_params).mvcost[0][sVar16] +
                       *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                               (ulong)((uint)(sVar17 != 0) * 4 + (uint)(sVar16 != 0) * 8)) +
                      (ms_params->mv_cost_params).mvcost[1][sVar17]) *
                      (ms_params->mv_cost_params).error_per_bit + 0x1000 >> 0xd;
            }
            uVar13 = iVar8 + uVar10;
            if (uVar13 < local_a8) {
              *bestmv = left_mv;
              *distortion = uVar10;
              *sse1 = (uint)diag_mv;
              dummy = 1;
              local_a8 = uVar13;
            }
            iVar8 = mv_limits->col_min;
          }
        }
        if (((iVar8 <= (int)right_mv >> 0x10) &&
            ((int)right_mv >> 0x10 <= (ms_params->mv_limits).col_max)) &&
           (((ms_params->mv_limits).row_min <= (int)right_mv.row &&
            ((int)right_mv.row <= (ms_params->mv_limits).row_max)))) {
          pbVar6 = (ms_params->var_params).ms_buffers.ref;
          iVar8 = pbVar6->stride;
          uVar10 = (*((ms_params->var_params).vfp)->osvf)
                             (pbVar6->buf +
                              (((int)right_mv >> 0x13) + (((int)right_mv << 0x10) >> 0x13) * iVar8),
                              iVar8,(uint)right_mv >> 0x10 & 7,(uint)right_mv & 7,
                              (ms_params->var_params).ms_buffers.wsrc,
                              (ms_params->var_params).ms_buffers.obmc_mask,(uint *)&diag_mv);
          iVar8 = 0;
          if ((ms_params->mv_cost_params).mv_cost_type == '\0') {
            pMVar7 = (ms_params->mv_cost_params).ref_mv;
            sVar17 = (right_mv.col - pMVar7->col) * 8;
            sVar16 = (right_mv.row - pMVar7->row) * 8;
            iVar8 = ((ms_params->mv_cost_params).mvcost[0][sVar16] +
                     *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                             (ulong)((uint)(sVar17 != 0) * 4 + (uint)(sVar16 != 0) * 8)) +
                    (ms_params->mv_cost_params).mvcost[1][sVar17]) *
                    (ms_params->mv_cost_params).error_per_bit + 0x1000 >> 0xd;
          }
          uVar9 = iVar8 + uVar10;
          if (uVar9 < local_a8) {
            *bestmv = right_mv;
            *distortion = uVar10;
            *sse1 = (uint)diag_mv;
            dummy = 1;
            local_a8 = uVar9;
          }
          iVar8 = mv_limits->col_min;
        }
        uVar10 = 0x7fffffff;
        if ((((int)top_mv >> 0x10 < iVar8) || ((ms_params->mv_limits).col_max < (int)top_mv >> 0x10)
            ) || ((int)top_mv.row < (ms_params->mv_limits).row_min)) {
          uVar11 = 0x7fffffff;
        }
        else {
          uVar11 = 0x7fffffff;
          if ((int)top_mv.row <= (ms_params->mv_limits).row_max) {
            pbVar6 = (ms_params->var_params).ms_buffers.ref;
            iVar8 = pbVar6->stride;
            uVar12 = (*((ms_params->var_params).vfp)->osvf)
                               (pbVar6->buf +
                                (((int)top_mv >> 0x13) + (((int)top_mv << 0x10) >> 0x13) * iVar8),
                                iVar8,(uint)top_mv >> 0x10 & 7,(uint)top_mv & 7,
                                (ms_params->var_params).ms_buffers.wsrc,
                                (ms_params->var_params).ms_buffers.obmc_mask,(uint *)&diag_mv);
            iVar8 = 0;
            if ((ms_params->mv_cost_params).mv_cost_type == '\0') {
              pMVar7 = (ms_params->mv_cost_params).ref_mv;
              sVar17 = (top_mv.col - pMVar7->col) * 8;
              sVar16 = (top_mv.row - pMVar7->row) * 8;
              iVar8 = ((ms_params->mv_cost_params).mvcost[0][sVar16] +
                       *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                               (ulong)((uint)(sVar17 != 0) * 4 + (uint)(sVar16 != 0) * 8)) +
                      (ms_params->mv_cost_params).mvcost[1][sVar17]) *
                      (ms_params->mv_cost_params).error_per_bit + 0x1000 >> 0xd;
            }
            uVar11 = iVar8 + uVar12;
            if (uVar11 < local_a8) {
              *bestmv = top_mv;
              *distortion = uVar12;
              *sse1 = (uint)diag_mv;
              local_a8 = uVar11;
            }
            iVar8 = mv_limits->col_min;
          }
        }
        if ((((iVar8 <= (int)bottom_mv >> 0x10) &&
             ((int)bottom_mv >> 0x10 <= (ms_params->mv_limits).col_max)) &&
            ((ms_params->mv_limits).row_min <= (int)bottom_mv.row)) &&
           ((int)bottom_mv.row <= (ms_params->mv_limits).row_max)) {
          pbVar6 = (ms_params->var_params).ms_buffers.ref;
          iVar8 = pbVar6->stride;
          uVar12 = (*((ms_params->var_params).vfp)->osvf)
                             (pbVar6->buf +
                              (((int)bottom_mv >> 0x13) + (((int)bottom_mv << 0x10) >> 0x13) * iVar8
                              ),iVar8,(uint)bottom_mv >> 0x10 & 7,(uint)bottom_mv & 7,
                              (ms_params->var_params).ms_buffers.wsrc,
                              (ms_params->var_params).ms_buffers.obmc_mask,(uint *)&diag_mv);
          iVar8 = 0;
          if ((ms_params->mv_cost_params).mv_cost_type == '\0') {
            pMVar7 = (ms_params->mv_cost_params).ref_mv;
            sVar17 = (bottom_mv.col - pMVar7->col) * 8;
            sVar16 = (bottom_mv.row - pMVar7->row) * 8;
            iVar8 = ((ms_params->mv_cost_params).mvcost[0][sVar16] +
                     *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                             (ulong)((uint)(sVar17 != 0) * 4 + (uint)(sVar16 != 0) * 8)) +
                    (ms_params->mv_cost_params).mvcost[1][sVar17]) *
                    (ms_params->mv_cost_params).error_per_bit + 0x1000 >> 0xd;
          }
          uVar10 = iVar8 + uVar12;
          if (uVar10 < local_a8) {
            *bestmv = bottom_mv;
            *distortion = uVar12;
            *sse1 = (uint)diag_mv;
            dummy = 1;
            local_a8 = uVar10;
          }
          iVar8 = mv_limits->col_min;
        }
        uVar12 = uVar20;
        if (uVar11 <= uVar10) {
          uVar12 = -uVar20;
        }
        uVar10 = uVar20;
        if (uVar13 <= uVar9) {
          uVar10 = -uVar20;
        }
        uVar9 = uVar12 & 0xffff | uVar10 << 0x10;
        uVar10 = uVar10 + uVar4;
        sVar17 = (short)uVar10;
        if ((iVar8 <= sVar17) && ((int)sVar17 <= (ms_params->mv_limits).col_max)) {
          uVar12 = uVar12 + uVar14;
          sVar16 = (short)uVar12;
          if (((ms_params->mv_limits).row_min <= (int)sVar16) &&
             ((int)sVar16 <= (ms_params->mv_limits).row_max)) {
            pbVar6 = (ms_params->var_params).ms_buffers.ref;
            iVar8 = pbVar6->stride;
            uVar13 = (*((ms_params->var_params).vfp)->osvf)
                               (pbVar6->buf +
                                (((int)(uVar10 * 0x10000) >> 0x13) +
                                ((int)((uVar12 & 0xffff) << 0x10) >> 0x13) * iVar8),iVar8,uVar10 & 7
                                ,uVar12 & 7,(ms_params->var_params).ms_buffers.wsrc,
                                (ms_params->var_params).ms_buffers.obmc_mask,(uint *)&diag_mv);
            iVar8 = 0;
            if ((ms_params->mv_cost_params).mv_cost_type == '\0') {
              pMVar7 = (ms_params->mv_cost_params).ref_mv;
              sVar21 = (sVar17 - pMVar7->col) * 8;
              sVar17 = (sVar16 - pMVar7->row) * 8;
              iVar8 = ((ms_params->mv_cost_params).mvcost[0][sVar17] +
                       *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                               (ulong)((uint)(sVar21 != 0) * 4 + (uint)(sVar17 != 0) * 8)) +
                      (ms_params->mv_cost_params).mvcost[1][sVar21]) *
                      (ms_params->mv_cost_params).error_per_bit + 0x1000 >> 0xd;
            }
            if (iVar8 + uVar13 < local_a8) {
              *bestmv = (MV)(uVar10 * 0x10000 | uVar12 & 0xffff);
              *distortion = uVar13;
              *sse1 = (uint)diag_mv;
              local_a8 = iVar8 + uVar13;
            }
          }
        }
      }
      else {
        uVar9 = obmc_check_better(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,
                                  &local_a8,sse1,distortion,&dummy);
        uVar10 = obmc_check_better(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,
                                   &local_a8,sse1,distortion,&dummy);
        uVar11 = obmc_check_better(xd,cm,&top_mv,bestmv,mv_limits,var_params,mv_cost_params,
                                   &local_a8,sse1,distortion,&dummy);
        uVar12 = obmc_check_better(xd,cm,&bottom_mv,bestmv,mv_limits,var_params,mv_cost_params,
                                   &local_a8,sse1,distortion,&dummy);
        uVar13 = uVar20;
        if (uVar11 <= uVar12) {
          uVar13 = -uVar20;
        }
        uVar11 = uVar20;
        if (uVar9 <= uVar10) {
          uVar11 = -uVar20;
        }
        uVar9 = uVar13 & 0xffff | uVar11 << 0x10;
        diag_mv.col = (short)uVar11 + uVar4;
        diag_mv.row = (short)uVar13 + uVar14;
        obmc_check_better(xd,cm,&diag_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_a8,sse1,
                          distortion,&dummy);
      }
      left_mv.row = bestmv->row;
      sVar17 = (short)(uVar9 >> 0x10);
      if (uVar14 == left_mv.row) {
        if ((uVar4 != bestmv->col && 1 < iVar5) && (uVar14 = bestmv->col, uVar4 != uVar14)) {
          uVar9 = -uVar9;
          sVar16 = sVar17;
LAB_001e5208:
          right_mv.row = (short)uVar9 + left_mv.row;
          dummy = CONCAT22(uVar14,right_mv.row);
          left_mv.col = uVar14 + sVar16;
          right_mv.col = uVar14 + sVar16;
          top_mv.row = 0;
          top_mv.col = 0;
          if ((ms_params->var_params).subpel_search_type == '\0') {
            iVar8 = mv_limits->col_min;
            bVar22 = false;
            if ((((iVar8 <= (short)uVar14) && ((int)(short)uVar14 <= (ms_params->mv_limits).col_max)
                 ) && ((ms_params->mv_limits).row_min <= (int)right_mv.row)) &&
               (bVar22 = false, (int)right_mv.row <= (ms_params->mv_limits).row_max)) {
              pbVar6 = (ms_params->var_params).ms_buffers.ref;
              iVar8 = pbVar6->stride;
              uVar9 = (*((ms_params->var_params).vfp)->osvf)
                                (pbVar6->buf +
                                 (((int)(short)uVar14 >> 3) + ((dummy << 0x10) >> 0x13) * iVar8),
                                 iVar8,uVar14 & 7,(ushort)right_mv.row & 7,
                                 (ms_params->var_params).ms_buffers.wsrc,
                                 (ms_params->var_params).ms_buffers.obmc_mask,(uint *)&diag_mv);
              iVar8 = 0;
              if ((ms_params->mv_cost_params).mv_cost_type == '\0') {
                pMVar7 = (ms_params->mv_cost_params).ref_mv;
                sVar17 = (dummy._2_2_ - pMVar7->col) * 8;
                sVar16 = ((short)dummy - pMVar7->row) * 8;
                iVar8 = ((ms_params->mv_cost_params).mvcost[0][sVar16] +
                         *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                 (ulong)((uint)(sVar17 != 0) * 4 + (uint)(sVar16 != 0) * 8)) +
                        (ms_params->mv_cost_params).mvcost[1][sVar17]) *
                        (ms_params->mv_cost_params).error_per_bit + 0x1000 >> 0xd;
              }
              bVar22 = iVar8 + uVar9 < local_a8;
              if (bVar22) {
                bestmv->row = (short)dummy;
                bestmv->col = dummy._2_2_;
                *distortion = uVar9;
                *sse1 = (uint)diag_mv;
                local_a8 = iVar8 + uVar9;
              }
              iVar8 = mv_limits->col_min;
            }
            if (((iVar8 <= (int)left_mv >> 0x10) &&
                ((int)left_mv >> 0x10 <= (ms_params->mv_limits).col_max)) &&
               (((ms_params->mv_limits).row_min <= (int)left_mv.row &&
                ((int)left_mv.row <= (ms_params->mv_limits).row_max)))) {
              pbVar6 = (ms_params->var_params).ms_buffers.ref;
              iVar8 = pbVar6->stride;
              uVar9 = (*((ms_params->var_params).vfp)->osvf)
                                (pbVar6->buf +
                                 (((int)left_mv >> 0x13) + (((int)left_mv << 0x10) >> 0x13) * iVar8)
                                 ,iVar8,(uint)left_mv >> 0x10 & 7,(uint)left_mv & 7,
                                 (ms_params->var_params).ms_buffers.wsrc,
                                 (ms_params->var_params).ms_buffers.obmc_mask,(uint *)&diag_mv);
              iVar8 = 0;
              if ((ms_params->mv_cost_params).mv_cost_type == '\0') {
                pMVar7 = (ms_params->mv_cost_params).ref_mv;
                sVar17 = (left_mv.col - pMVar7->col) * 8;
                sVar16 = (left_mv.row - pMVar7->row) * 8;
                iVar8 = ((ms_params->mv_cost_params).mvcost[0][sVar16] +
                         *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                 (ulong)((uint)(sVar17 != 0) * 4 + (uint)(sVar16 != 0) * 8)) +
                        (ms_params->mv_cost_params).mvcost[1][sVar17]) *
                        (ms_params->mv_cost_params).error_per_bit + 0x1000 >> 0xd;
              }
              if (iVar8 + uVar9 < local_a8) {
                *bestmv = left_mv;
                *distortion = uVar9;
                *sse1 = (uint)diag_mv;
                top_mv.row = 1;
                top_mv.col = 0;
                bVar22 = true;
                local_a8 = iVar8 + uVar9;
              }
            }
            if (((bVar22) && (mv_limits->col_min <= (int)right_mv >> 0x10)) &&
               (((int)right_mv >> 0x10 <= (ms_params->mv_limits).col_max &&
                (((ms_params->mv_limits).row_min <= (int)right_mv.row &&
                 ((int)right_mv.row <= (ms_params->mv_limits).row_max)))))) {
              pbVar6 = (ms_params->var_params).ms_buffers.ref;
              iVar8 = pbVar6->stride;
              uVar9 = (*((ms_params->var_params).vfp)->osvf)
                                (pbVar6->buf +
                                 (((int)right_mv >> 0x13) +
                                 (((int)right_mv << 0x10) >> 0x13) * iVar8),iVar8,
                                 (uint)right_mv >> 0x10 & 7,(uint)right_mv & 7,
                                 (ms_params->var_params).ms_buffers.wsrc,
                                 (ms_params->var_params).ms_buffers.obmc_mask,(uint *)&diag_mv);
              iVar8 = 0;
              if ((ms_params->mv_cost_params).mv_cost_type == '\0') {
                pMVar7 = (ms_params->mv_cost_params).ref_mv;
                sVar17 = (right_mv.col - pMVar7->col) * 8;
                sVar16 = (right_mv.row - pMVar7->row) * 8;
                iVar8 = ((ms_params->mv_cost_params).mvcost[0][sVar16] +
                         *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                 (ulong)((uint)(sVar17 != 0) * 4 + (uint)(sVar16 != 0) * 8)) +
                        (ms_params->mv_cost_params).mvcost[1][sVar17]) *
                        (ms_params->mv_cost_params).error_per_bit + 0x1000 >> 0xd;
              }
              if (iVar8 + uVar9 < local_a8) {
                *bestmv = right_mv;
                *distortion = uVar9;
                *sse1 = (uint)diag_mv;
                local_a8 = iVar8 + uVar9;
              }
            }
          }
          else {
            obmc_check_better(xd,cm,(MV *)&dummy,bestmv,mv_limits,var_params,mv_cost_params,
                              &local_a8,sse1,distortion,(int *)&top_mv);
            obmc_check_better(xd,cm,&left_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_a8,
                              sse1,distortion,(int *)&top_mv);
            if (top_mv != (MV)0x0) {
              obmc_check_better(xd,cm,&right_mv,bestmv,mv_limits,var_params,mv_cost_params,&local_a8
                                ,sse1,distortion,(int *)&top_mv);
            }
          }
        }
      }
      else if (1 < iVar5) {
        uVar14 = bestmv->col;
        sVar16 = -sVar17;
        if (uVar4 != uVar14) {
          sVar16 = sVar17;
        }
        goto LAB_001e5208;
      }
      uVar20 = uVar20 >> 1;
      local_40 = local_40 + -1;
    } while (local_40 != 0);
  }
  return local_a8;
}

Assistant:

int av1_find_best_obmc_sub_pixel_tree_up(
    MACROBLOCKD *xd, const AV1_COMMON *const cm,
    const SUBPEL_MOTION_SEARCH_PARAMS *ms_params, MV start_mv,
    const FULLPEL_MV_STATS *start_mv_stats, MV *bestmv, int *distortion,
    unsigned int *sse1, int_mv *last_mv_search_list) {
  (void)last_mv_search_list;
  (void)start_mv_stats;
  const int allow_hp = ms_params->allow_hp;
  const int forced_stop = ms_params->forced_stop;
  const int iters_per_step = ms_params->iters_per_step;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const SUBPEL_SEARCH_VAR_PARAMS *var_params = &ms_params->var_params;
  const SUBPEL_SEARCH_TYPE subpel_search_type =
      ms_params->var_params.subpel_search_type;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;

  int hstep = INIT_SUBPEL_STEP_SIZE;
  const int round = AOMMIN(FULL_PEL - forced_stop, 3 - !allow_hp);

  unsigned int besterr = INT_MAX;
  *bestmv = start_mv;

  if (subpel_search_type != USE_2_TAPS_ORIG)
    besterr = upsampled_setup_obmc_center_error(
        xd, cm, bestmv, var_params, mv_cost_params, sse1, distortion);
  else
    besterr = setup_obmc_center_error(bestmv, var_params, mv_cost_params, sse1,
                                      distortion);

  for (int iter = 0; iter < round; ++iter) {
    MV iter_center_mv = *bestmv;
    MV diag_step = obmc_first_level_check(xd, cm, iter_center_mv, bestmv, hstep,
                                          mv_limits, var_params, mv_cost_params,
                                          &besterr, sse1, distortion);

    if (!CHECK_MV_EQUAL(iter_center_mv, *bestmv) && iters_per_step > 1) {
      obmc_second_level_check_v2(xd, cm, iter_center_mv, diag_step, bestmv,
                                 mv_limits, var_params, mv_cost_params,
                                 &besterr, sse1, distortion);
    }
    hstep >>= 1;
  }

  return besterr;
}